

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name-tree.c
# Opt level: O1

nametree_entry_t * ndn_nametree_find(ndn_nametree_t *nametree,uint8_t *name,size_t len)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  nametree_entry_t *pnVar4;
  ulong uVar5;
  size_t __n;
  ushort uVar6;
  bool bVar7;
  
  if (len < 2) {
LAB_00114898:
    pnVar4 = (nametree_entry_t *)0x0;
  }
  else {
    uVar2 = 0;
    for (uVar3 = (ulong)(0xfc < name[1]) * 2 + 2; uVar3 < len; uVar3 = uVar3 + uVar5) {
      uVar5 = (ulong)name[uVar3 + 1] + 2;
      __n = 0x24;
      if (uVar5 < 0x24) {
        __n = uVar5;
      }
      uVar6 = *(ushort *)(nametree + uVar2 * 0x2e + 0x26);
      if (uVar6 == 0xffff) {
        bVar7 = false;
      }
      else {
        do {
          iVar1 = memcmp(name + uVar3,nametree + (ulong)uVar6 * 0x2e,__n);
          if (iVar1 < 1) goto LAB_00114928;
          uVar6 = *(ushort *)(nametree + (ulong)uVar6 * 0x2e + 0x28);
        } while (uVar6 != 0xffff);
        iVar1 = 1;
LAB_00114928:
        bVar7 = iVar1 == 0;
      }
      if (!bVar7) goto LAB_00114898;
      uVar2 = (ulong)uVar6;
    }
    pnVar4 = (nametree_entry_t *)(nametree + uVar2 * 0x2e);
  }
  return pnVar4;
}

Assistant:

nametree_entry_t*
ndn_nametree_find(ndn_nametree_t *nametree, uint8_t name[], size_t len)
{
  int now_node, father = 0 , tmp;
  size_t component_len, eqiv_component_len, offset = 0;
  // TODO: Put it into decoder
  if (len < 2) return NULL;
  if (name[1] < 253) offset = 2; else offset = 4;
  while (offset < len) {
    component_len = name[offset + 1] + 2;
    eqiv_component_len = minof2(component_len, NDN_NAME_COMPONENT_BUFFER_SIZE);
    now_node = (*nametree)[father].left_child;
    tmp = -2;
    while (now_node != NDN_INVALID_ID) {
      tmp = memcmp(name+offset, (*nametree)[now_node].val , eqiv_component_len);
      if (tmp <= 0) break;
      now_node = (*nametree)[now_node].right_bro;
    }
    if (tmp != 0) {
      return NULL;
    }
    offset += component_len;
    father = now_node;
  }
  return &(*nametree)[father];
}